

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

bool __thiscall
llama_context::state_save_file
          (llama_context *this,char *filepath,llama_token *tokens,size_t n_token_count)

{
  llama_file *in_RDI;
  llama_io_write_file io;
  llama_file file;
  llama_io_write_file *this_00;
  
  this_00 = (llama_io_write_file *)&stack0xffffffffffffffd8;
  llama_file::llama_file((llama_file *)this_00,(char *)in_RDI,(char *)0x3e052c);
  llama_file::write_u32((llama_file *)this_00,(uint32_t)((ulong)in_RDI >> 0x20));
  llama_file::write_u32((llama_file *)this_00,(uint32_t)((ulong)in_RDI >> 0x20));
  llama_file::write_u32((llama_file *)this_00,(uint32_t)((ulong)in_RDI >> 0x20));
  llama_file::write_raw((llama_file *)this_00,in_RDI,0x3e0576);
  llama_io_write_file::llama_io_write_file(this_00,in_RDI);
  state_write_data(this,(llama_io_write_i *)filepath);
  llama_io_write_file::~llama_io_write_file(this_00);
  llama_file::~llama_file((llama_file *)0x3e05ad);
  return true;
}

Assistant:

bool llama_context::state_save_file(const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_SESSION_MAGIC);
    file.write_u32(LLAMA_SESSION_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_write_data(io);

    return true;
}